

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

int __thiscall
fmt::v10::detail::digit_grouping<char>::next(digit_grouping<char> *this,next_state *state)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  ulong uVar4;
  char *pcVar5;
  reference pcVar6;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RSI;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  undefined8 local_20;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_18;
  int local_4;
  
  local_18 = in_RSI;
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    this_00 = local_18;
    local_20 = std::__cxx11::string::end();
    bVar1 = __gnu_cxx::operator==
                      ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                       in_stack_ffffffffffffffb8);
    if (bVar1) {
      pcVar5 = (char *)std::__cxx11::string::back();
      local_4 = (int)*pcVar5 + *(int *)&local_18[1]._M_current;
      *(int *)&local_18[1]._M_current = local_4;
    }
    else {
      pcVar6 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(local_18);
      if ('\0' < *pcVar6) {
        pcVar6 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(local_18);
        iVar3 = (int)*pcVar6;
        cVar2 = max_value<char>();
        if (iVar3 != cVar2) {
          local_28 = __gnu_cxx::
                     __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator++(this_00,iVar3);
          pcVar6 = __gnu_cxx::
                   __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(&local_28);
          *(int *)&local_18[1]._M_current = (int)*pcVar6 + *(int *)&local_18[1]._M_current;
          return *(int *)&local_18[1]._M_current;
        }
      }
      local_4 = max_value<int>();
    }
  }
  else {
    local_4 = max_value<int>();
  }
  return local_4;
}

Assistant:

int next(next_state& state) const {
    if (thousands_sep_.empty()) return max_value<int>();
    if (state.group == grouping_.end()) return state.pos += grouping_.back();
    if (*state.group <= 0 || *state.group == max_value<char>())
      return max_value<int>();
    state.pos += *state.group++;
    return state.pos;
  }